

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

string * Catch::StringMaker<float,void>::convert_abi_cxx11_(float value)

{
  string *in_RDI;
  int in_stack_00000048;
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  __lhs = &local_30;
  psVar1 = in_RDI;
  fpToString<float>(value,in_stack_00000048);
  std::operator+(__lhs,(char)((ulong)psVar1 >> 0x38));
  std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

std::string StringMaker<float>::convert(float value) {
    return fpToString(value, precision) + 'f';
}